

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<0ul,char_const(&)[4]>
          (Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
           *this,char (*params) [7])

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  StringHasher *in_RDX;
  size_t extraout_RDX;
  long lVar9;
  uint uVar10;
  StringPtr str;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  undefined8 local_38;
  ulong uVar11;
  
  lVar9 = 0;
  if (*(long *)(params + 8) != 0) {
    lVar3 = *(long *)params;
    sVar7 = strlen((char *)in_RDX);
    str.content.size_ = extraout_RDX;
    str.content.ptr = (char *)(sVar7 + 1);
    uVar6 = _::anon_unknown_0::StringHasher::hashCode(in_RDX,str);
    lVar8 = *(long *)(params + 8);
    uVar10 = (int)lVar8 - 1U & uVar6;
    while( true ) {
      uVar11 = (ulong)uVar10;
      lVar4 = *(long *)(params[6] + 6);
      iVar2 = *(int *)(lVar4 + 4 + uVar11 * 8);
      if (iVar2 == 0) break;
      if ((iVar2 != 1) && (*(uint *)(lVar4 + uVar11 * 8) == uVar6)) {
        lVar8 = (ulong)(iVar2 - 2) * 0x18;
        local_38 = *(undefined8 *)(lVar3 + 0x10 + lVar8);
        puVar1 = (undefined8 *)(lVar3 + lVar8);
        local_48.ptr = (char *)*puVar1;
        local_48.size_ = puVar1[1];
        sVar7 = strlen((char *)in_RDX);
        local_58.size_ = sVar7 + 1;
        bVar5 = ArrayPtr<const_char>::operator==(&local_48,&local_58);
        if (bVar5) {
          lVar9 = (ulong)(*(int *)(lVar4 + 4 + uVar11 * 8) - 2) * 0x18 + *(long *)params;
          break;
        }
        lVar8 = *(long *)(params + 8);
      }
      uVar10 = (uint)(uVar11 + 1);
      if (uVar11 + 1 == lVar8) {
        uVar10 = 0;
      }
    }
  }
  *(long *)this = lVar9;
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}